

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

void __thiscall icu_63::TextTrieMap::~TextTrieMap(TextTrieMap *this)

{
  long *plVar1;
  UObjectDeleter *pUVar2;
  void *pvVar3;
  UVector *this_00;
  int iVar4;
  long lVar5;
  long lVar6;
  
  this->_vptr_TextTrieMap = (_func_int **)&PTR__TextTrieMap_003a4180;
  if (0 < this->fNodesCount) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      plVar1 = *(long **)((long)&this->fNodes->fValues + lVar5);
      if (plVar1 != (long *)0x0) {
        if ((&this->fNodes->fHasValuesVector)[lVar5] == '\0') {
          if (this->fValueDeleter != (UObjectDeleter *)0x0) {
            (*this->fValueDeleter)(plVar1);
          }
        }
        else {
          (**(code **)(*plVar1 + 8))();
        }
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < this->fNodesCount);
  }
  uprv_free_63(this->fNodes);
  this_00 = this->fLazyContents;
  if (this_00 != (UVector *)0x0) {
    if (0 < this_00->count) {
      iVar4 = 0;
      do {
        pUVar2 = this->fValueDeleter;
        if (pUVar2 != (UObjectDeleter *)0x0) {
          pvVar3 = UVector::elementAt(this_00,iVar4 + 1);
          (*pUVar2)(pvVar3);
          this_00 = this->fLazyContents;
        }
        iVar4 = iVar4 + 2;
      } while (iVar4 < this_00->count);
    }
    (*(this_00->super_UObject)._vptr_UObject[1])();
    return;
  }
  return;
}

Assistant:

TextTrieMap::~TextTrieMap() {
    int32_t index;
    for (index = 0; index < fNodesCount; ++index) {
        fNodes[index].deleteValues(fValueDeleter);
    }
    uprv_free(fNodes);
    if (fLazyContents != NULL) {
        for (int32_t i=0; i<fLazyContents->size(); i+=2) {
            if (fValueDeleter) {
                fValueDeleter(fLazyContents->elementAt(i+1));
            }
        } 
        delete fLazyContents;
    }
}